

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  int iVar1;
  char *pcVar2;
  int __c;
  FieldDescriptor *in_RDX;
  AlphaNum *a;
  java *this_00;
  string local_80;
  string local_60;
  AlphaNum local_40;
  
  this_00 = (java *)this->descriptor_;
  iVar1 = 0;
  if (*(long *)(this_00 + 0x60) == 0) {
    UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_60,this_00,in_RDX);
    pcVar2 = FieldDescriptor::index(this->descriptor_,(char *)this_00,__c);
    strings::AlphaNum::AlphaNum(&local_40,(int)pcVar2);
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_40,a);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
               (char (*) [5])0x38d8c6,&local_60,(char (*) [6])0x3a0f1a,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    iVar1 = 0x15;
  }
  return iVar1;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}